

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElectromagneticEmissionSystemData.cpp
# Opt level: O1

bool __thiscall
DIS::ElectromagneticEmissionSystemData::operator==
          (ElectromagneticEmissionSystemData *this,ElectromagneticEmissionSystemData *rhs)

{
  uchar uVar1;
  uchar uVar2;
  unsigned_short uVar3;
  unsigned_short uVar4;
  bool bVar5;
  bool bVar6;
  pointer pEVar7;
  long lVar8;
  ulong uVar9;
  
  uVar1 = rhs->_systemDataLength;
  uVar2 = this->_systemDataLength;
  uVar3 = rhs->_emissionsPadding2;
  uVar4 = this->_emissionsPadding2;
  bVar5 = EmitterSystem::operator==(&this->_emitterSystem,&rhs->_emitterSystem);
  bVar6 = Vector3Float::operator==(&this->_location,&rhs->_location);
  bVar5 = ((bVar6 && bVar5) && uVar4 == uVar3) && uVar2 == uVar1;
  pEVar7 = (this->_beamDataRecords).
           super__Vector_base<DIS::ElectromagneticEmissionBeamData,_std::allocator<DIS::ElectromagneticEmissionBeamData>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_beamDataRecords).
      super__Vector_base<DIS::ElectromagneticEmissionBeamData,_std::allocator<DIS::ElectromagneticEmissionBeamData>_>
      ._M_impl.super__Vector_impl_data._M_finish != pEVar7) {
    lVar8 = 0;
    uVar9 = 0;
    do {
      bVar6 = ElectromagneticEmissionBeamData::operator==
                        ((ElectromagneticEmissionBeamData *)
                         ((long)&pEVar7->_vptr_ElectromagneticEmissionBeamData + lVar8),
                         (ElectromagneticEmissionBeamData *)
                         ((long)&((rhs->_beamDataRecords).
                                  super__Vector_base<DIS::ElectromagneticEmissionBeamData,_std::allocator<DIS::ElectromagneticEmissionBeamData>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                 _vptr_ElectromagneticEmissionBeamData + lVar8));
      if (!bVar6) {
        bVar5 = false;
      }
      uVar9 = uVar9 + 1;
      pEVar7 = (this->_beamDataRecords).
               super__Vector_base<DIS::ElectromagneticEmissionBeamData,_std::allocator<DIS::ElectromagneticEmissionBeamData>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar8 = lVar8 + 0x60;
    } while (uVar9 < (ulong)(((long)(this->_beamDataRecords).
                                    super__Vector_base<DIS::ElectromagneticEmissionBeamData,_std::allocator<DIS::ElectromagneticEmissionBeamData>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar7 >> 5)
                            * -0x5555555555555555));
  }
  return bVar5;
}

Assistant:

bool ElectromagneticEmissionSystemData::operator ==(const ElectromagneticEmissionSystemData& rhs) const
 {
     bool ivarsEqual = true;

     if( ! (_systemDataLength == rhs._systemDataLength) ) ivarsEqual = false;
     if( ! (_emissionsPadding2 == rhs._emissionsPadding2) ) ivarsEqual = false;
     if( ! (_emitterSystem == rhs._emitterSystem) ) ivarsEqual = false;
     if( ! (_location == rhs._location) ) ivarsEqual = false;

     for(size_t idx = 0; idx < _beamDataRecords.size(); idx++)
     {
        if( ! ( _beamDataRecords[idx] == rhs._beamDataRecords[idx]) ) ivarsEqual = false;
     }


    return ivarsEqual;
 }